

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_formatting.cpp
# Opt level: O0

wstring * conv_to_char<wchar_t>(char *p)

{
  char *in_RSI;
  wstring *in_RDI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *r;
  char *local_10;
  
  std::__cxx11::wstring::wstring(in_RDI);
  local_10 = in_RSI;
  while (*local_10 != '\0') {
    std::__cxx11::wstring::operator+=(in_RDI,(int)*local_10);
    local_10 = local_10 + 1;
  }
  return in_RDI;
}

Assistant:

std::basic_string<CharType> conv_to_char(char const *p)
{
    std::basic_string<CharType> r;
    while(*p)
        r+=CharType(*p++);
    return r;
}